

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O0

dlep_radio_if * dlep_radio_add_interface(char *ifname)

{
  dlep_session *pdVar1;
  dlep_session_ext_ip *pdVar2;
  int iVar3;
  dlep_radio_if *interface;
  char *ifname_local;
  
  ifname_local = (char *)dlep_radio_get_by_layer2_if(ifname);
  if ((dlep_radio_if *)ifname_local == (dlep_radio_if *)0x0) {
    ifname_local = (char *)oonf_class_malloc(&_interface_class);
    if ((dlep_if *)ifname_local == (dlep_if *)0x0) {
      ifname_local = (char *)0x0;
    }
    else {
      iVar3 = dlep_if_add((dlep_if *)ifname_local,ifname,&_l2_origin,&_l2_default_origin,
                          (_func_int_os_interface_listener_ptr *)0x0,LOG_DLEP_RADIO,true);
      if (iVar3 == 0) {
        pdVar2 = &(((dlep_if *)((long)ifname_local + 0xbb0))->session)._ext_ip;
        (pdVar2->if_ip_v4)._addr[8] = 0xc0;
        (pdVar2->if_ip_v4)._addr[9] = 0xd4;
        (pdVar2->if_ip_v4)._addr[10] = '\x01';
        (pdVar2->if_ip_v4)._addr[0xb] = '\0';
        (pdVar2->if_ip_v4)._addr[0xc] = '\0';
        (pdVar2->if_ip_v4)._addr[0xd] = '\0';
        (pdVar2->if_ip_v4)._addr[0xe] = '\0';
        (pdVar2->if_ip_v4)._addr[0xf] = '\0';
        *(undefined8 *)&(((dlep_if *)((long)ifname_local + 0xbb0))->session)._ext_ip.if_ip_v4._type
             = 0x1000;
        pdVar1 = &((dlep_if *)((long)ifname_local + 0xbb0))->session;
        (pdVar1->_ext_ip).if_ip_v4._addr[0] = '\x03';
        (pdVar1->_ext_ip).if_ip_v4._addr[1] = '\0';
        (pdVar1->_ext_ip).if_ip_v4._addr[2] = '\0';
        (pdVar1->_ext_ip).if_ip_v4._addr[3] = '\0';
        dlep_radio_session_initialize_tcp_callbacks
                  ((oonf_stream_config *)
                   &(((dlep_if *)((long)ifname_local + 0xbb0))->session)._ext_ip.prefix_modification
                    .comp);
        oonf_stream_add_managed((oonf_stream_managed *)((long)ifname_local + 0xbb0));
      }
      else {
        oonf_class_free(&_interface_class,ifname_local);
        ifname_local = (char *)0x0;
      }
    }
  }
  return (dlep_radio_if *)ifname_local;
}

Assistant:

struct dlep_radio_if *
dlep_radio_add_interface(const char *ifname) {
  struct dlep_radio_if *interface;

  interface = dlep_radio_get_by_layer2_if(ifname);
  if (interface) {
    return interface;
  }

  interface = oonf_class_malloc(&_interface_class);
  if (!interface) {
    return NULL;
  }

  if (dlep_if_add(&interface->interf, ifname, &_l2_origin, &_l2_default_origin, NULL, LOG_DLEP_RADIO, true)) {
    oonf_class_free(&_interface_class, interface);
    return NULL;
  }

  /* configure TCP server socket */
  interface->tcp.config.session_timeout = 120000; /* 120 seconds */
  interface->tcp.config.maximum_input_buffer = 4096;
  interface->tcp.config.allowed_sessions = 3;
  dlep_radio_session_initialize_tcp_callbacks(&interface->tcp.config);

  oonf_stream_add_managed(&interface->tcp);

  return interface;
}